

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

bool __thiscall QAM::operator<(QAM *this,QAM *rhs)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator<(&this->qam,&rhs->qam);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&this->qam,&rhs->qam);
    if (bVar1) {
      bVar1 = std::operator<(&this->tag,&rhs->tag);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator<(const QAM & rhs) const
    {
        if(qam < rhs.qam)
            return true;
        else if(qam == rhs.qam)
            return tag < rhs.tag;
        else
            return false;
    }